

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

int GetCombinedHistogramEntropy
              (VP8LHistogram *a,VP8LHistogram *b,int64_t cost_threshold_in,uint64_t *cost)

{
  uint32_t uVar1;
  uint64_t uVar2;
  ulong *in_RCX;
  ulong in_RDX;
  long *in_RSI;
  uint32_t *in_RDI;
  uint32_t color_b;
  uint32_t color_r;
  uint32_t color_a;
  uint64_t cost_threshold;
  int trivial_at_end;
  int palette_code_bits;
  ulong uVar3;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if ((long)in_RDX < 1) {
    iVar4 = 0;
  }
  else {
    uVar3 = in_RDX;
    VP8LHistogramNumCodes(in_RDI[0x32a]);
    uVar2 = GetCombinedEntropy((uint32_t *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)(uVar3 >> 0x20),
                               (int)uVar3);
    *in_RCX = uVar2;
    uVar1 = (*VP8LExtraCostCombined)
                      ((uint32_t *)(*(long *)in_RDI + 0x400),(uint32_t *)(*in_RSI + 0x400),0x18);
    *in_RCX = (ulong)uVar1 * 0x800000 + *in_RCX;
    if (*in_RCX < in_RDX) {
      uVar2 = GetCombinedEntropy((uint32_t *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                 (int)(uVar3 >> 0x20),(int)uVar3);
      *in_RCX = uVar2 + *in_RCX;
      if (*in_RCX < in_RDX) {
        uVar2 = GetCombinedEntropy((uint32_t *)
                                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                   in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                   (int)(uVar3 >> 0x20),(int)uVar3);
        *in_RCX = uVar2 + *in_RCX;
        if (*in_RCX < in_RDX) {
          uVar2 = GetCombinedEntropy((uint32_t *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                     (int)(uVar3 >> 0x20),(int)uVar3);
          *in_RCX = uVar2 + *in_RCX;
          if (*in_RCX < in_RDX) {
            uVar2 = GetCombinedEntropy((uint32_t *)
                                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                                       ,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                                       (int)(uVar3 >> 0x20),(int)uVar3);
            *in_RCX = uVar2 + *in_RCX;
            uVar1 = (*VP8LExtraCostCombined)(in_RDI + 0x302,(uint32_t *)(in_RSI + 0x181),0x28);
            *in_RCX = (ulong)uVar1 * 0x800000 + *in_RCX;
            if (*in_RCX < in_RDX) {
              iVar4 = 1;
            }
            else {
              iVar4 = 0;
            }
          }
          else {
            iVar4 = 0;
          }
        }
        else {
          iVar4 = 0;
        }
      }
      else {
        iVar4 = 0;
      }
    }
    else {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

WEBP_NODISCARD static int GetCombinedHistogramEntropy(
    const VP8LHistogram* const a, const VP8LHistogram* const b,
    int64_t cost_threshold_in, uint64_t* cost) {
  const int palette_code_bits = a->palette_code_bits_;
  int trivial_at_end = 0;
  const uint64_t cost_threshold = (uint64_t)cost_threshold_in;
  assert(a->palette_code_bits_ == b->palette_code_bits_);
  if (cost_threshold_in <= 0) return 0;
  *cost = GetCombinedEntropy(a->literal_, b->literal_,
                             VP8LHistogramNumCodes(palette_code_bits),
                             a->is_used_[0], b->is_used_[0], 0);
  *cost += (uint64_t)VP8LExtraCostCombined(a->literal_ + NUM_LITERAL_CODES,
                                           b->literal_ + NUM_LITERAL_CODES,
                                           NUM_LENGTH_CODES)
           << LOG_2_PRECISION_BITS;
  if (*cost >= cost_threshold) return 0;

  if (a->trivial_symbol_ != VP8L_NON_TRIVIAL_SYM &&
      a->trivial_symbol_ == b->trivial_symbol_) {
    // A, R and B are all 0 or 0xff.
    const uint32_t color_a = (a->trivial_symbol_ >> 24) & 0xff;
    const uint32_t color_r = (a->trivial_symbol_ >> 16) & 0xff;
    const uint32_t color_b = (a->trivial_symbol_ >> 0) & 0xff;
    if ((color_a == 0 || color_a == 0xff) &&
        (color_r == 0 || color_r == 0xff) &&
        (color_b == 0 || color_b == 0xff)) {
      trivial_at_end = 1;
    }
  }

  *cost += GetCombinedEntropy(a->red_, b->red_, NUM_LITERAL_CODES,
                              a->is_used_[1], b->is_used_[1], trivial_at_end);
  if (*cost >= cost_threshold) return 0;

  *cost += GetCombinedEntropy(a->blue_, b->blue_, NUM_LITERAL_CODES,
                              a->is_used_[2], b->is_used_[2], trivial_at_end);
  if (*cost >= cost_threshold) return 0;

  *cost += GetCombinedEntropy(a->alpha_, b->alpha_, NUM_LITERAL_CODES,
                              a->is_used_[3], b->is_used_[3], trivial_at_end);
  if (*cost >= cost_threshold) return 0;

  *cost += GetCombinedEntropy(a->distance_, b->distance_, NUM_DISTANCE_CODES,
                              a->is_used_[4], b->is_used_[4], 0);
  *cost += (uint64_t)VP8LExtraCostCombined(a->distance_, b->distance_,
                                           NUM_DISTANCE_CODES)
           << LOG_2_PRECISION_BITS;
  if (*cost >= cost_threshold) return 0;

  return 1;
}